

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O3

string * __thiscall
FIX::IntTConvertor<unsigned_long>::convert_abi_cxx11_
          (string *__return_storage_ptr__,IntTConvertor<unsigned_long> *this,unsigned_long value)

{
  bool bVar1;
  byte bVar2;
  IntTConvertor<unsigned_long> *pIVar3;
  undefined1 *puVar4;
  long lVar5;
  char buffer [21];
  byte abStack_1b [6];
  undefined2 local_15;
  undefined1 local_13 [11];
  
  pIVar3 = this;
  puVar4 = local_13;
  if ((IntTConvertor<unsigned_long> *)0x63 < this) {
    do {
      this = (IntTConvertor<unsigned_long> *)((ulong)pIVar3 / 100);
      *(undefined2 *)(puVar4 + -2) =
           *(undefined2 *)(digit_pairs + (ulong)(uint)((int)pIVar3 + (int)this * -100) * 2);
      puVar4 = puVar4 + -2;
      bVar1 = (IntTConvertor<unsigned_long> *)0x270f < pIVar3;
      pIVar3 = this;
    } while (bVar1);
  }
  if (this < (IntTConvertor<unsigned_long> *)0xa) {
    bVar2 = (byte)this | 0x30;
    lVar5 = -1;
  }
  else {
    bVar2 = digit_pairs[(long)this * 2];
    puVar4[-1] = digit_pairs[(long)this * 2 + 1];
    lVar5 = -2;
  }
  puVar4[lVar5] = bVar2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,puVar4 + lVar5,local_13);
  return __return_storage_ptr__;
}

Assistant:

static std::string convert(T value) {
    // buffer is big enough for significant digits and extra digit,
    // minus and null
    char buffer[std::numeric_limits<T>::digits10 + 2];
    const char *const start = integer_to_string(buffer, sizeof(buffer), value);
    return std::string(start, buffer + sizeof(buffer) - start);
  }